

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

void loadFunction(LoadState *S,Proto *f)

{
  lu_byte lVar1;
  byte bVar2;
  int iVar3;
  Proto *f_local;
  LoadState *S_local;
  
  iVar3 = loadInt(S);
  f->linedefined = iVar3;
  iVar3 = loadInt(S);
  f->lastlinedefined = iVar3;
  lVar1 = loadByte(S);
  f->numparams = lVar1;
  bVar2 = loadByte(S);
  f->flag = bVar2 & 1;
  if (S->fixed != '\0') {
    f->flag = f->flag | 2;
  }
  lVar1 = loadByte(S);
  f->maxstacksize = lVar1;
  loadCode(S,f);
  loadConstants(S,f);
  loadUpvalues(S,f);
  loadProtos(S,f);
  loadString(S,f,&f->source);
  loadDebug(S,f);
  return;
}

Assistant:

static void loadFunction (LoadState *S, Proto *f) {
  f->linedefined = loadInt(S);
  f->lastlinedefined = loadInt(S);
  f->numparams = loadByte(S);
  f->flag = loadByte(S) & PF_ISVARARG;  /* get only the meaningful flags */
  if (S->fixed)
    f->flag |= PF_FIXED;  /* signal that code is fixed */
  f->maxstacksize = loadByte(S);
  loadCode(S, f);
  loadConstants(S, f);
  loadUpvalues(S, f);
  loadProtos(S, f);
  loadString(S, f, &f->source);
  loadDebug(S, f);
}